

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

long __thiscall Arcflow::go(Arcflow *this)

{
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *this_00;
  pointer piVar1;
  int *piVar2;
  pointer pvVar3;
  pointer pIVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  iterator iVar9;
  uint *puVar10;
  runtime_error *this_01;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  vector<int,_std::allocator<int>_> *in_RSI;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  bool bVar19;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> valid_opts;
  vector<int,_std::allocator<int>_> sv;
  vector<int,_std::allocator<int>_> key;
  vector<int,_std::allocator<int>_> maxw;
  char _error_msg_ [256];
  int local_238;
  vector<int,_std::allocator<int>_> local_228;
  int local_20c;
  vector<int,_std::allocator<int>_> local_208;
  ulong local_1e8;
  long local_1e0;
  pointer local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  vector<int,_std::allocator<int>_> local_1b8;
  NodeSet *local_1a0;
  int *local_198;
  vector<int,_std::allocator<int>_> local_190;
  vector<int,_std::allocator<int>_> local_178;
  vector<int,_std::allocator<int>_> local_160;
  Arc local_144;
  vector<int,_std::allocator<int>_> local_138 [11];
  
  lVar8 = (long)(this->inst).ndims;
  piVar1 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar13 = 0;
  if ((this->inst).binary == false) {
    iVar13 = piVar1[lVar8 + 1];
  }
  uVar7 = piVar1[lVar8];
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_228,&this->max_label);
  local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_190,(long)(this->inst).ndims,(value_type *)local_138,
             (allocator_type *)&local_1b8);
  local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  if (0 < (this->inst).nbtypes) {
    iVar6 = 0;
    do {
      uVar11 = (ulong)(this->inst).ndims;
      bVar19 = (long)uVar11 < 1;
      if ((long)uVar11 < 1) {
LAB_0010bad6:
        if (bVar19) {
          if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_208,
                       (iterator)
                       local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_138);
          }
          else {
            *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar6;
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (0 < (this->inst).ndims) {
            pvVar3 = (this->inst).Ws.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar8 = 0;
            do {
              iVar6 = *(int *)(*(long *)&pvVar3[(int)local_138[0].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + lVar8 * 4);
              iVar14 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8];
              if (iVar6 < local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]) {
                iVar14 = iVar6;
              }
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] = iVar14;
              iVar6 = *(int *)(*(long *)&pvVar3[(int)local_138[0].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + lVar8 * 4);
              if (iVar6 < local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]) {
                iVar6 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8];
              }
              local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] = iVar6;
              lVar8 = lVar8 + 1;
            } while (lVar8 < (this->inst).ndims);
          }
        }
      }
      else {
        piVar18 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar2 = (this->inst).Ws.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar6].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (*piVar18 <= *piVar2) {
          uVar5 = 1;
          do {
            uVar17 = uVar5;
            if (uVar11 == uVar17) break;
            uVar5 = uVar17 + 1;
          } while (piVar18[uVar17] <= piVar2[uVar17]);
          bVar19 = uVar11 <= uVar17;
          goto LAB_0010bad6;
        }
      }
      iVar6 = (int)local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar6);
    } while (iVar6 < (this->inst).nbtypes);
  }
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    in_RSI = (vector<int,_std::allocator<int>_> *)0xffffffff;
    goto LAB_0010c072;
  }
  uVar11 = (ulong)(this->inst).ndims;
  bVar19 = (long)uVar11 < 1;
  if ((long)uVar11 < 1) {
LAB_0010bbe1:
    if (bVar19) {
      uVar7 = NodeSet::get_index(&this->NS,&local_228);
      in_RSI = (vector<int,_std::allocator<int>_> *)(ulong)uVar7;
      goto LAB_0010c072;
    }
  }
  else {
    piVar18 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (*piVar18 ==
        *local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
      uVar5 = 1;
      do {
        uVar17 = uVar5;
        if (uVar11 == uVar17) break;
        uVar5 = uVar17 + 1;
      } while (piVar18[uVar17] ==
               local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17]);
      bVar19 = uVar11 <= uVar17;
      goto LAB_0010bbe1;
    }
  }
  lift_state(this,&local_208,in_RSI,uVar7,iVar13);
  hash(&local_1b8,this,in_RSI);
  this_00 = &this->dp;
  iVar9 = std::
          _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::find(&this_00->_M_t,&local_1b8);
  if ((_Rb_tree_header *)iVar9._M_node == &(this->dp)._M_t._M_impl.super__Rb_tree_header) {
    iVar6 = uVar7 + 1;
    local_238 = -1;
    if (iVar6 < (this->inst).nsizes) {
      std::vector<int,_std::allocator<int>_>::vector(&local_1d0,in_RSI);
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(this->inst).ndims] = iVar6;
      if ((this->inst).binary == false) {
        local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)(this->inst).ndims + 1] = 0;
      }
      std::vector<int,_std::allocator<int>_>::vector(&local_160,&local_1d0);
      lVar8 = go(this);
      local_238 = (int)lVar8;
      if (local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_238 == -1) {
        snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "up != -1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x138);
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,(char *)local_138);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      NodeSet::get_label(local_138,&this->NS,local_238);
      piVar1 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (piVar1 != (pointer)0x0) {
        operator_delete(piVar1);
      }
      if (local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (((int)uVar7 < (this->inst).nsizes) &&
       (local_1e0 = (long)(int)uVar7,
       iVar13 < (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_1e0])) {
      local_1e8 = (ulong)uVar7;
      std::vector<int,_std::allocator<int>_>::vector(local_138,in_RSI);
      local_1d8 = (this->weights).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_1e0;
      pIVar4 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar18 = pIVar4[local_1e0].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_198 = *(pointer *)
                   ((long)&pIVar4[local_1e0].nonzero.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl + 8);
      bVar19 = piVar18 == local_198;
      local_20c = iVar13;
      if (!bVar19) {
        local_1a0 = &this->NS;
        do {
          lVar8 = (long)*piVar18;
          iVar13 = local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8] +
                   *(int *)(*(long *)&(local_1d8->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data + lVar8 * 4);
          local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar8] = iVar13;
          if (local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] < iVar13) {
            uVar7 = NodeSet::get_index(local_1a0,&local_228);
            in_RSI = (vector<int,_std::allocator<int>_> *)(ulong)uVar7;
            puVar10 = (uint *)std::
                              map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                              ::operator[](this_00,&local_1b8);
            *puVar10 = uVar7;
            break;
          }
          piVar18 = piVar18 + 1;
          bVar19 = piVar18 == local_198;
        } while (!bVar19);
      }
      if (!bVar19) {
        if (local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        goto LAB_0010c060;
      }
      iVar13 = (int)local_1e8;
      if ((this->inst).binary == true) {
        local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(this->inst).ndims] = iVar6;
      }
      else {
        iVar14 = (this->inst).ndims;
        if (local_20c + 1 <
            (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_1e0]) {
          local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar14] = iVar13;
          local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(long)(this->inst).ndims + 1] = local_20c + 1;
        }
        else {
          local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar14] = iVar6;
          local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(long)(this->inst).ndims + 1] = 0;
        }
      }
      std::vector<int,_std::allocator<int>_>::vector(&local_178,local_138);
      lVar8 = go(this);
      if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar14 = (int)lVar8;
      if (iVar14 != -1) {
        NodeSet::get_label(&local_1d0,&this->NS,iVar14);
        iVar16 = (this->inst).ndims;
        if (0 < iVar16) {
          lVar8 = *(long *)&(local_1d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data;
          lVar15 = 0;
          do {
            iVar16 = local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15] - *(int *)(lVar8 + lVar15 * 4);
            if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] <= iVar16) {
              iVar16 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15];
            }
            local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15] = iVar16;
            lVar15 = lVar15 + 1;
            iVar16 = (this->inst).ndims;
          } while (lVar15 < iVar16);
        }
        if ((this->inst).binary != false) {
          iVar12 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar16];
          if (iVar6 < local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar16]) {
            iVar12 = iVar6;
          }
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar16] = iVar12;
        }
        iVar6 = NodeSet::get_index(&this->NS,&local_228);
        local_144.u = iVar6;
        local_144.v = iVar14;
        local_144.label = iVar13;
        std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::
        _M_insert_unique<Arc>(&(this->AS)._M_t,&local_144);
        if (iVar6 != local_238 && local_238 != -1) {
          local_144.label = this->LOSS;
          local_144.v = local_238;
          local_144.u = iVar6;
          std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::
          _M_insert_unique<Arc>(&(this->AS)._M_t,&local_144);
        }
        if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    uVar7 = NodeSet::get_index(&this->NS,&local_228);
    in_RSI = (vector<int,_std::allocator<int>_> *)(ulong)uVar7;
    puVar10 = (uint *)std::
                      map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                      ::operator[](this_00,&local_1b8);
    *puVar10 = uVar7;
  }
  else {
    in_RSI = (vector<int,_std::allocator<int>_> *)(ulong)*(uint *)&iVar9._M_node[1]._M_right;
  }
LAB_0010c060:
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0010c072:
  if (local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (ulong)in_RSI & 0xffffffff;
}

Assistant:

int Arcflow::go(std::vector<int> su) {
	int it = su[inst.ndims];
	int ic = inst.binary ? 0 : su[inst.ndims + 1];
	std::vector<int> valid_opts;
	std::vector<int> mu(max_label);
	std::vector<int> maxw(inst.ndims, 0);
	for (int t = 0; t < inst.nbtypes; t++) {
		if (is_valid(su, inst.Ws[t])) {
			valid_opts.push_back(t);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], inst.Ws[t][d]);
				maxw[d] = std::max(maxw[d], inst.Ws[t][d]);
			}
		}
	}
	if (valid_opts.empty()) {  // if invalid
		return -1;
	} else if (is_full(su, maxw)) {  // if full
		return NS.get_index(mu);
	} else {
		lift_state(valid_opts, su, it, ic);
	}

	// const vector<int> key(su);
	const std::vector<int> key(hash(su));
	std::map<std::vector<int>, int>::iterator itr = dp.find(key);
	if (itr != dp.end()) {
		return itr->second;
	}

	int up = -1;
	if (it + 1 < inst.nsizes) {
		std::vector<int> sv(su);
		sv[inst.ndims] = it + 1;
		if (!inst.binary) {
			sv[inst.ndims + 1] = 0;
		}
		up = go(sv);
		throw_assert(up != -1);
		mu = NS.get_label(up);
	}

	if (it < inst.nsizes && ic < max_rep[it]) {
		std::vector<int> sv(su);
		const std::vector<int> &w = weights[it];
		for (int d : sitems[it].nonzero) {
			sv[d] += w[d];
			if (sv[d] > maxw[d]) {  // if invalid
				return dp[key] = NS.get_index(mu);
			}
		}

		if (inst.binary) {
			sv[inst.ndims] = it + 1;
		} else {
			if (ic + 1 < max_rep[it]) {
				sv[inst.ndims] = it;
				sv[inst.ndims + 1] = ic + 1;
			} else {
				sv[inst.ndims] = it + 1;
				sv[inst.ndims + 1] = 0;
			}
		}

		int iv = go(sv);

		if (iv != -1) {
			const std::vector<int> &v = NS.get_label(iv);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], v[d] - w[d]);
			}
			if (inst.binary) {
				mu[inst.ndims] = std::min(mu[inst.ndims], it + 1);
			}
			int iu = NS.get_index(mu);
			AS.insert(Arc(iu, iv, it));
			if (up != -1 && iu != up) {
				AS.insert(Arc(iu, up, LOSS));
			}
		}
	}

	return dp[key] = NS.get_index(mu);
}